

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsObjectHasOwnProperty(JsValueRef object,JsValueRef propertyId,bool *hasOwnProperty)

{
  anon_class_24_3_d8cf1857 fn;
  JsErrorCode JVar1;
  bool **in_stack_ffffffffffffffc0;
  bool *local_20;
  bool *hasOwnProperty_local;
  JsValueRef propertyId_local;
  JsValueRef object_local;
  
  fn.propertyId = &local_20;
  fn.object = &hasOwnProperty_local;
  fn.hasOwnProperty = in_stack_ffffffffffffffc0;
  local_20 = hasOwnProperty;
  hasOwnProperty_local = (bool *)propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<true,JsObjectHasOwnProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsObjectHasOwnProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId, _Out_ bool *hasOwnProperty)
{
    return ContextAPIWrapper<true>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(hasOwnProperty);
        *hasOwnProperty = false;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        return JsHasOwnPropertyCommon(scriptContext, object, propertyRecord, hasOwnProperty, Js::VarIs<Js::PropertyString>(propertyId) ? (Js::PropertyString*)propertyId : nullptr);
    });
}